

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ExtraBuilderInterfaces_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  AlphaNum *in_R8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string_view local_48 [3];
  
  local_48[0] = absl::lts_20250127::NullSafeStringView
                          ("// @@protoc_insertion_point(builder_implements:");
  local_78.piece_._M_len = (size_t)*(ushort *)(*(long *)(this + 0x10) + 2);
  local_78.piece_._M_str = (char *)(~local_78.piece_._M_len + *(long *)(this + 0x10));
  local_a8.piece_ = absl::lts_20250127::NullSafeStringView(")");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_48,&local_78,&local_a8,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtraBuilderInterfaces(const Descriptor* descriptor) {
  return absl::StrCat("// @@protoc_insertion_point(builder_implements:",
                      descriptor->full_name(), ")");
}